

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_DecodeStereoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t predictor;
  uint8_t predictor_00;
  ushort uVar1;
  undefined8 uVar2;
  float *pfVar3;
  int16_t iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint8_t *puVar8;
  long lVar9;
  int16_t r_delta;
  int16_t l_delta;
  int16_t local_1044;
  int16_t local_1042;
  int16_t local_1040;
  int16_t local_103e;
  int16_t local_103c;
  int16_t local_103a;
  uint local_1038;
  uint local_1034;
  uint local_1030;
  int local_102c;
  FAudioVoice *local_1028;
  ulong local_1020;
  ulong local_1018;
  float *local_1010;
  undefined8 local_1008;
  int16_t aiStack_1000 [2024];
  
  uVar5 = (uint)((voice->field_18).src.format)->nBlockAlign;
  local_1038 = (uVar5 & 0xfffffffe) - 0xc;
  uVar7 = (voice->field_18).src.curBufferOffset;
  uVar6 = (ulong)uVar7 % (ulong)local_1038;
  puVar8 = buffer->pAudioData + (uVar7 / local_1038) * uVar5;
  local_1018 = 0;
  local_1034 = samples;
  local_1028 = voice;
  while (local_1030 = local_1034 - (uint)local_1018,
        (uint)local_1018 <= local_1034 && local_1030 != 0) {
    local_102c = (int)uVar6;
    local_1020 = (ulong)(local_1038 - local_102c);
    uVar1 = ((local_1028->field_18).src.format)->nBlockAlign;
    predictor = *puVar8;
    predictor_00 = puVar8[1];
    local_103a = *(int16_t *)(puVar8 + 2);
    local_103c = *(int16_t *)(puVar8 + 4);
    uVar2 = *(undefined8 *)(puVar8 + 6);
    local_103e = (int16_t)uVar2;
    local_1040 = (int16_t)((ulong)uVar2 >> 0x10);
    local_1042 = (int16_t)((ulong)uVar2 >> 0x20);
    local_1044 = (int16_t)((ulong)uVar2 >> 0x30);
    local_1008 = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
    local_1010 = decodeCache;
    for (lVar9 = 0; pfVar3 = local_1010, uVar1 - 0xe != (int)lVar9; lVar9 = lVar9 + 1) {
      iVar4 = FAudio_INTERNAL_ParseNibble
                        (puVar8[lVar9 + 0xe] >> 4,predictor,&local_103a,&local_103e,&local_1042);
      aiStack_1000[lVar9 * 2] = iVar4;
      iVar4 = FAudio_INTERNAL_ParseNibble
                        (puVar8[lVar9 + 0xe] & 0xf,predictor_00,&local_103c,&local_1040,&local_1044)
      ;
      aiStack_1000[lVar9 * 2 + 1] = iVar4;
    }
    uVar7 = (uint)local_1020;
    if (local_1030 < (uint)local_1020) {
      uVar7 = local_1030;
    }
    (*FAudio_INTERNAL_Convert_S16_To_F32)
              ((int16_t *)((long)&local_1008 + (long)(local_102c * 2) * 2),local_1010,uVar7 * 2);
    decodeCache = pfVar3 + uVar7 * 2;
    puVar8 = puVar8 + lVar9 + 0xe;
    uVar6 = 0;
    local_1018 = (ulong)(uVar7 + (int)local_1018);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeStereoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[2024]; /* Max block size */

	/* Align, block size */
	uint32_t bsize = ((voice->src.format->nBlockAlign / 2) - 6) * 2;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeStereoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + (midOffset * 2),
			decodeCache,
			copy * 2
		);
		decodeCache += copy * 2;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}